

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O0

s_profile * ssw_init(int8_t *read,int32_t readLen,int8_t *mat,int32_t n,int8_t score_size)

{
  s_profile *psVar1;
  __m128i *palVar2;
  int local_38;
  int local_34;
  int32_t i;
  int32_t bias;
  s_profile *p;
  int8_t score_size_local;
  int32_t n_local;
  int8_t *mat_local;
  int32_t readLen_local;
  int8_t *read_local;
  
  psVar1 = (s_profile *)calloc(1,0x30);
  psVar1->profile_byte = (__m128i *)0x0;
  psVar1->profile_word = (__m128i *)0x0;
  psVar1->bias = '\0';
  if ((score_size == '\0') || (score_size == '\x02')) {
    local_34 = 0;
    for (local_38 = 0; local_38 < n * n; local_38 = local_38 + 1) {
      if (mat[local_38] < local_34) {
        local_34 = (int)mat[local_38];
      }
    }
    if (local_34 < 1) {
      local_34 = -local_34;
    }
    psVar1->bias = (uint8_t)local_34;
    palVar2 = qP_byte(read,mat,readLen,n,(uint8_t)local_34);
    psVar1->profile_byte = palVar2;
  }
  if ((score_size == '\x01') || (score_size == '\x02')) {
    palVar2 = qP_word(read,mat,readLen,n);
    psVar1->profile_word = palVar2;
  }
  psVar1->read = read;
  psVar1->mat = mat;
  psVar1->readLen = readLen;
  psVar1->n = n;
  return psVar1;
}

Assistant:

s_profile* ssw_init (const int8_t* read, const int32_t readLen, const int8_t* mat, const int32_t n, const int8_t score_size) {
	s_profile* p = (s_profile*)calloc(1, sizeof(struct _profile));
	p->profile_byte = 0;
	p->profile_word = 0;
	p->bias = 0;

	if (score_size == 0 || score_size == 2) {
		/* Find the bias to use in the substitution matrix */
		int32_t bias = 0, i;
		for (i = 0; i < n*n; i++) if (mat[i] < bias) bias = mat[i];
		bias = abs(bias);

		p->bias = bias;
		p->profile_byte = qP_byte (read, mat, readLen, n, bias);
	}
	if (score_size == 1 || score_size == 2) p->profile_word = qP_word (read, mat, readLen, n);
	p->read = read;
	p->mat = mat;
	p->readLen = readLen;
	p->n = n;
	return p;
}